

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetPropertyQuery
          (JavascriptProxy *this,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  anon_class_40_5_f688fe24 fn_00;
  anon_class_16_2_2734512a getPropertyId_00;
  JavascriptString *pJVar1;
  bool bVar2;
  PropertyQueryFlags PVar3;
  RecyclableObject *pRVar4;
  PropertyDescriptor local_110;
  Type local_e0;
  Type TStack_df;
  undefined6 uStack_de;
  ScriptContext **local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  PropertyValueInfo **local_b0;
  BOOL local_a4;
  undefined1 local_a0 [4];
  BOOL foundProperty;
  PropertyDescriptor result;
  anon_class_16_2_2734512a getPropertyId;
  anon_class_40_5_f688fe24 fn;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  JavascriptProxy *this_local;
  
  fn.info = (PropertyValueInfo **)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = this;
  PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
  PropertyValueInfo::DisablePrototypeCache
            ((PropertyValueInfo *)requestContext_local,(RecyclableObject *)this);
  getPropertyId.propertyNameString = &propertyNameString_local;
  fn.originalInstance = &value_local;
  fn.propertyNameString = (JavascriptString **)&info_local;
  fn.value = &fn.info;
  fn.requestContext = &requestContext_local;
  result._40_8_ = &fn.info;
  getPropertyId.requestContext = (ScriptContext **)&value_local;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
  pJVar1 = propertyNameString_local;
  memcpy(&local_d0,&getPropertyId.propertyNameString,0x28);
  local_e0 = result.Configurable;
  TStack_df = result.fromProxy;
  uStack_de = result._42_6_;
  local_d8 = getPropertyId.requestContext;
  getPropertyId_00.propertyNameString = (JavascriptString **)getPropertyId.requestContext;
  getPropertyId_00.requestContext = (ScriptContext **)result._40_8_;
  fn_00.propertyNameString = (JavascriptString **)uStack_c8;
  fn_00.originalInstance = (Var *)local_d0;
  fn_00.value = (Var **)local_c0;
  fn_00.requestContext = (ScriptContext **)uStack_b8;
  fn_00.info = local_b0;
  local_a4 = GetPropertyTrap<Js::JavascriptProxy::GetPropertyQuery(void*,Js::JavascriptString*,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetPropertyQuery(void*,Js::JavascriptString*,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1>
                       (this,pJVar1,(PropertyDescriptor *)local_a0,fn_00,getPropertyId_00,
                        (ScriptContext *)fn.info);
  if (local_a4 == 0) {
    pRVar4 = ScriptContext::GetMissingPropertyResult((ScriptContext *)fn.info);
    info_local->m_instance = pRVar4;
  }
  else {
    bVar2 = PropertyDescriptor::IsFromProxy((PropertyDescriptor *)local_a0);
    pJVar1 = propertyNameString_local;
    if (bVar2) {
      PropertyDescriptor::PropertyDescriptor(&local_110,(PropertyDescriptor *)local_a0);
      pRVar4 = (RecyclableObject *)
               GetValueFromDescriptor(this,pJVar1,&local_110,(ScriptContext *)fn.info);
      info_local->m_instance = pRVar4;
    }
  }
  PVar3 = JavascriptConversion::BooleanToPropertyQueryFlags(local_a4);
  return PVar3;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
        // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(originalInstance, object, propertyNameString, value, requestContext, info);
        };
        auto getPropertyId = [&]()->PropertyId{
            const PropertyRecord* propertyRecord;
            requestContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }